

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

bool __thiscall cmFindBase::CheckForVariableDefined(cmFindBase *this)

{
  string *name;
  bool bVar1;
  int iVar2;
  CacheEntryType CVar3;
  cmValue cVar4;
  cmState *this_00;
  cmValue cVar5;
  char *extraout_RDX;
  string_view value;
  string local_50;
  
  name = &this->VariableName;
  cVar4 = cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,name);
  if (cVar4.Value != (string *)0x0) {
    this_00 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
    cVar5 = cmState::GetCacheEntryValue(this_00,name);
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsNOTFOUND((cmValue *)(cVar4.Value)->_M_string_length,value);
    local_50._M_dataplus._M_p = (pointer)cVar5;
    iVar2 = cmValue::Compare((cmValue *)&local_50,(cmValue)0x0);
    if (iVar2 == 0) {
      CVar3 = UNINITIALIZED;
    }
    else {
      CVar3 = cmState::GetCacheEntryType(this_00,name);
      if (CVar3 != UNINITIALIZED) {
        this->VariableType = CVar3;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"HELPSTRING","");
        cVar4 = cmState::GetCacheEntryProperty(this_00,name,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (cVar4.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&this->VariableDocumentation);
        }
      }
    }
    if (!bVar1) {
      if ((iVar2 != 0) && (CVar3 == UNINITIALIZED)) {
        this->AlreadyInCacheWithoutMetaInfo = true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool cmFindBase::CheckForVariableDefined()
{
  if (cmValue value = this->Makefile->GetDefinition(this->VariableName)) {
    cmState* state = this->Makefile->GetState();
    cmValue cacheEntry = state->GetCacheEntryValue(this->VariableName);
    bool found = !cmIsNOTFOUND(*value);
    bool cached = cacheEntry != nullptr;
    auto cacheType = cached ? state->GetCacheEntryType(this->VariableName)
                            : cmStateEnums::UNINITIALIZED;

    if (cached && cacheType != cmStateEnums::UNINITIALIZED) {
      this->VariableType = cacheType;
      if (const auto& hs =
            state->GetCacheEntryProperty(this->VariableName, "HELPSTRING")) {
        this->VariableDocumentation = *hs;
      }
    }

    if (found) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the
      // original value.  Tell the subclass implementations to do
      // this.
      if (cached && cacheType == cmStateEnums::UNINITIALIZED) {
        this->AlreadyInCacheWithoutMetaInfo = true;
      }
      return true;
    }
  }
  return false;
}